

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPrivkey * __thiscall
cfd::core::ExtPrivkey::DerivePrivkey
          (ExtPrivkey *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  allocator local_51;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,"ExtPrivkey",&local_51);
  ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,string_path,
                    &local_38,(this->super_Extkey).depth_);
  ::std::__cxx11::string::~string((string *)&local_38);
  DerivePrivkey(__return_storage_ptr__,this,
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey ExtPrivkey::DerivePrivkey(const std::string& string_path) const {
  std::vector<uint32_t> path =
      ToArrayFromString(string_path, "ExtPrivkey", depth_);
  return DerivePrivkey(path);
}